

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer.cc
# Opt level: O0

Format * __thiscall
google::protobuf::io::Printer::TokenizeFormat
          (Format *__return_storage_ptr__,Printer *this,string_view format_string,
          PrintOptions *options)

{
  string_view *psVar1;
  PrintOptions opts;
  FunctionRef<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
  message;
  basic_string_view<char,_std::char_traits<char>_> __x;
  basic_string_view<char,_std::char_traits<char>_> __x_00;
  string_view s;
  string_view s_00;
  string_view text;
  string_view prefix;
  string_view text_00;
  basic_string_view<char,_std::char_traits<char>_> __str;
  basic_string_view<char,_std::char_traits<char>_> bVar2;
  Splitter<absl::lts_20250127::ByChar,_absl::lts_20250127::AllowEmpty,_std::basic_string_view<char,_std::char_traits<char>_>_>
  *pSVar3;
  size_t sVar4;
  bool bVar5;
  reference pvVar6;
  const_pointer __str_00;
  size_type sVar7;
  size_type sVar8;
  Splitter<absl::lts_20250127::ByChar,_absl::lts_20250127::AllowEmpty,_std::basic_string_view<char,_std::char_traits<char>_>_>
  *pSVar9;
  reference this_00;
  reference this_01;
  char *pcVar10;
  char d;
  PrintOptions *pPVar11;
  string_view str;
  string_view expected;
  ConvertibleToStringView text_01;
  string_view expected_00;
  ConvertibleToStringView text_02;
  basic_string_view<char,_std::char_traits<char>_> bVar12;
  string_view sVar13;
  bool local_429;
  size_t local_3f8;
  bool local_3e9;
  value_type *last;
  anon_class_8_1_898e5cf2 local_370;
  VoidPtr local_368;
  PrintOptions *local_360;
  undefined8 local_358;
  bool local_350;
  value_type local_348;
  basic_string_view<char,_std::char_traits<char>_> local_330;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> local_320;
  size_t local_310;
  char *local_308;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> local_300;
  size_t local_2f0;
  char *local_2e8;
  reference local_2e0;
  value_type *prev;
  string_view chunk;
  const_iterator __end3;
  const_iterator __begin3;
  ConvertibleToStringView local_258;
  Splitter<absl::lts_20250127::ByChar,_absl::lts_20250127::AllowEmpty,_std::basic_string_view<char,_std::char_traits<char>_>_>
  local_248;
  Splitter<absl::lts_20250127::ByChar,_absl::lts_20250127::AllowEmpty,_std::basic_string_view<char,_std::char_traits<char>_>_>
  *local_230;
  Splitter<absl::lts_20250127::ByChar,_absl::lts_20250127::AllowEmpty,_std::basic_string_view<char,_std::char_traits<char>_>_>
  *__range3;
  size_t total_len;
  reference pvStack_218;
  bool is_var;
  value_type *line;
  char *local_208;
  char *local_200;
  size_t line_indent;
  char *pcStack_1f0;
  basic_string_view<char,_std::char_traits<char>_> local_1e0;
  lts_20250127 *local_1d0;
  char *pcStack_1c8;
  size_t local_1c0;
  char *local_1b8;
  size_type local_1b0;
  size_t comment_index;
  string_view line_text;
  const_iterator __end2;
  const_iterator __begin2;
  ConvertibleToStringView local_120;
  Splitter<absl::lts_20250127::ByChar,_absl::lts_20250127::AllowEmpty,_std::basic_string_view<char,_std::char_traits<char>_>_>
  local_110;
  Splitter<absl::lts_20250127::ByChar,_absl::lts_20250127::AllowEmpty,_std::basic_string_view<char,_std::char_traits<char>_>_>
  *local_f8;
  Splitter<absl::lts_20250127::ByChar,_absl::lts_20250127::AllowEmpty,_std::basic_string_view<char,_std::char_traits<char>_>_>
  *__range2;
  undefined1 auStack_e8 [7];
  bool is_first;
  Printer *local_d8;
  char *local_d0;
  basic_string_view<char,_std::char_traits<char>_> local_c8;
  size_t local_b8;
  char *local_b0;
  size_type local_a8;
  size_t next_newline_index;
  char *local_98;
  Printer *local_90;
  char *local_88;
  basic_string_view<char,_std::char_traits<char>_> local_70;
  undefined1 local_60 [8];
  string_view first_pp_directive;
  string_view orig;
  size_t raw_string_indent;
  PrintOptions *options_local;
  Printer *this_local;
  string_view format_string_local;
  Format *format;
  
  pcVar10 = format_string._M_str;
  this_local = (Printer *)format_string._M_len;
  pPVar11 = options;
  format_string_local._M_len = (size_t)pcVar10;
  format_string_local._M_str = (char *)__return_storage_ptr__;
  Format::Format(__return_storage_ptr__);
  sVar4 = format_string_local._M_len;
  orig._M_str = (char *)0x0;
  format_string_local._M_len = sVar4;
  if ((options->strip_raw_string_indentation & 1U) != 0) {
    first_pp_directive._M_str = (char *)this_local;
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)local_60);
    bVar2._M_str = (char *)format_string_local._M_len;
    bVar2._M_len = local_b8;
    bVar12._M_str = local_b0;
    bVar12._M_len = (size_t)pcVar10;
    while( true ) {
      format_string_local._M_len = (size_t)bVar2._M_str;
      local_b8 = bVar2._M_len;
      local_b0 = bVar12._M_str;
      pcVar10 = (char *)bVar12._M_len;
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_70,"\n");
      sVar13._M_str = pcVar10;
      sVar13._M_len = (size_t)local_70._M_str;
      bVar5 = absl::lts_20250127::ConsumePrefix
                        ((lts_20250127 *)&this_local,(Nonnull<absl::string_view_*>)local_70._M_len,
                         sVar13);
      if (!bVar5) break;
      local_90 = this_local;
      local_88 = (char *)format_string_local._M_len;
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                ((basic_string_view<char,_std::char_traits<char>_> *)&next_newline_index,"#");
      text_00._M_str = local_88;
      text_00._M_len = (size_t)local_90;
      prefix._M_str = local_98;
      prefix._M_len = next_newline_index;
      pcVar10 = local_98;
      bVar5 = absl::lts_20250127::StartsWith(text_00,prefix);
      if (bVar5) {
        bVar5 = std::basic_string_view<char,_std::char_traits<char>_>::empty
                          ((basic_string_view<char,_std::char_traits<char>_> *)local_60);
        if (bVar5) {
          local_60 = (undefined1  [8])this_local;
          first_pp_directive._M_len = format_string_local._M_len;
        }
        local_a8 = std::basic_string_view<char,_std::char_traits<char>_>::find
                             ((basic_string_view<char,_std::char_traits<char>_> *)&this_local,'\n',0
                             );
        if (local_a8 == 0xffffffffffffffff) goto LAB_003c3749;
        bVar12 = std::basic_string_view<char,_std::char_traits<char>_>::substr
                           ((basic_string_view<char,_std::char_traits<char>_> *)&this_local,local_a8
                            ,0xffffffffffffffff);
        this_local = (Printer *)bVar12._M_len;
        bVar2 = bVar12;
      }
      else {
LAB_003c3749:
        orig._M_str = (char *)0x0;
        __return_storage_ptr__->is_raw_string = true;
        while( true ) {
          std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_c8," ");
          expected._M_str = pcVar10;
          expected._M_len = (size_t)local_c8._M_str;
          bVar5 = absl::lts_20250127::ConsumePrefix
                            ((lts_20250127 *)&this_local,
                             (Nonnull<absl::string_view_*>)local_c8._M_len,expected);
          bVar2._M_str = (char *)format_string_local._M_len;
          bVar2._M_len = local_b8;
          bVar12._M_str = local_b0;
          bVar12._M_len = (size_t)pcVar10;
          if (!bVar5) break;
          orig._M_str = orig._M_str + 1;
        }
      }
    }
    bVar5 = std::basic_string_view<char,_std::char_traits<char>_>::empty
                      ((basic_string_view<char,_std::char_traits<char>_> *)local_60);
    if (!bVar5) {
      this_local = (Printer *)local_60;
      format_string_local._M_len = first_pp_directive._M_len;
    }
    bVar5 = std::basic_string_view<char,_std::char_traits<char>_>::empty
                      ((basic_string_view<char,_std::char_traits<char>_> *)&this_local);
    if (bVar5) {
      this_local = (Printer *)first_pp_directive._M_str;
      __return_storage_ptr__->is_raw_string = false;
      orig._M_str = (char *)0x0;
      format_string_local._M_len = sVar4;
    }
    if ((this->at_start_of_line_ & 1U) == 0) {
      local_d8 = this_local;
      local_d0 = (char *)format_string_local._M_len;
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                ((basic_string_view<char,_std::char_traits<char>_> *)auStack_e8,"#");
      text._M_str = local_d0;
      text._M_len = (size_t)local_d8;
      bVar5 = absl::lts_20250127::StartsWith(text,_auStack_e8);
      if (bVar5) {
        this_local = (Printer *)first_pp_directive._M_str;
        format_string_local._M_len = sVar4;
      }
    }
  }
  __range2._7_1_ = 1;
  s_00._M_str = (char *)format_string_local._M_len;
  s_00._M_len = (size_t)this_local;
  absl::lts_20250127::strings_internal::ConvertibleToStringView::ConvertibleToStringView
            (&local_120,s_00);
  text_01.value_._M_str = (char *)0xa;
  text_01.value_._M_len = (size_t)local_120.value_._M_str;
  absl::lts_20250127::StrSplit<char>
            (&local_110,(lts_20250127 *)local_120.value_._M_len,text_01,(char)pPVar11);
  local_f8 = &local_110;
  absl::lts_20250127::strings_internal::
  Splitter<absl::lts_20250127::ByChar,_absl::lts_20250127::AllowEmpty,_std::basic_string_view<char,_std::char_traits<char>_>_>
  ::begin((const_iterator *)&__end2.delimiter_,local_f8);
  absl::lts_20250127::strings_internal::
  Splitter<absl::lts_20250127::ByChar,_absl::lts_20250127::AllowEmpty,_std::basic_string_view<char,_std::char_traits<char>_>_>
  ::end((const_iterator *)&line_text._M_str,local_f8);
  do {
    bVar5 = absl::lts_20250127::strings_internal::operator!=
                      ((SplitIterator<absl::lts_20250127::strings_internal::Splitter<absl::lts_20250127::ByChar,_absl::lts_20250127::AllowEmpty,_std::basic_string_view<char,_std::char_traits<char>_>_>_>
                        *)&__end2.delimiter_,
                       (SplitIterator<absl::lts_20250127::strings_internal::Splitter<absl::lts_20250127::ByChar,_absl::lts_20250127::AllowEmpty,_std::basic_string_view<char,_std::char_traits<char>_>_>_>
                        *)&line_text._M_str);
    if (!bVar5) {
      if ((__return_storage_ptr__->is_raw_string & 1U) != 0) {
        while( true ) {
          bVar5 = std::
                  vector<google::protobuf::io::Printer::Format::Line,_std::allocator<google::protobuf::io::Printer::Format::Line>_>
                  ::empty(&__return_storage_ptr__->lines);
          local_429 = false;
          if (!bVar5) {
            this_01 = std::
                      vector<google::protobuf::io::Printer::Format::Line,_std::allocator<google::protobuf::io::Printer::Format::Line>_>
                      ::back(&__return_storage_ptr__->lines);
            local_429 = std::
                        vector<google::protobuf::io::Printer::Format::Chunk,_std::allocator<google::protobuf::io::Printer::Format::Chunk>_>
                        ::empty(&this_01->chunks);
          }
          if (local_429 == false) break;
          std::
          vector<google::protobuf::io::Printer::Format::Line,_std::allocator<google::protobuf::io::Printer::Format::Line>_>
          ::pop_back(&__return_storage_ptr__->lines);
        }
      }
      return __return_storage_ptr__;
    }
    pvVar6 = absl::lts_20250127::strings_internal::
             SplitIterator<absl::lts_20250127::strings_internal::Splitter<absl::lts_20250127::ByChar,_absl::lts_20250127::AllowEmpty,_std::basic_string_view<char,_std::char_traits<char>_>_>_>
             ::operator*((SplitIterator<absl::lts_20250127::strings_internal::Splitter<absl::lts_20250127::ByChar,_absl::lts_20250127::AllowEmpty,_std::basic_string_view<char,_std::char_traits<char>_>_>_>
                          *)&__end2.delimiter_);
    comment_index = pvVar6->_M_len;
    line_text._M_len = (size_t)pvVar6->_M_str;
    pcVar10 = (char *)line_text._M_len;
    if ((__return_storage_ptr__->is_raw_string & 1U) == 0) {
LAB_003c3a70:
      local_200 = (char *)0x0;
      while( true ) {
        local_3e9 = false;
        if ((__range2._7_1_ & 1) == 0) {
          std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                    ((basic_string_view<char,_std::char_traits<char>_> *)&line," ");
          expected_00._M_str = pcVar10;
          expected_00._M_len = (size_t)local_208;
          local_3e9 = absl::lts_20250127::ConsumePrefix
                                ((lts_20250127 *)&comment_index,(Nonnull<absl::string_view_*>)line,
                                 expected_00);
        }
        d = (char)pPVar11;
        if (local_3e9 == false) break;
        local_200 = local_200 + 1;
      }
      __range2._7_1_ = 0;
      std::
      vector<google::protobuf::io::Printer::Format::Line,_std::allocator<google::protobuf::io::Printer::Format::Line>_>
      ::emplace_back<>(&__return_storage_ptr__->lines);
      pvStack_218 = std::
                    vector<google::protobuf::io::Printer::Format::Line,_std::allocator<google::protobuf::io::Printer::Format::Line>_>
                    ::back(&__return_storage_ptr__->lines);
      if (orig._M_str < local_200) {
        local_3f8 = (long)local_200 - (long)orig._M_str;
      }
      else {
        local_3f8 = 0;
      }
      pvStack_218->indent = local_3f8;
      total_len._7_1_ = 0;
      __range3 = (Splitter<absl::lts_20250127::ByChar,_absl::lts_20250127::AllowEmpty,_std::basic_string_view<char,_std::char_traits<char>_>_>
                  *)0x0;
      s._M_str = (char *)line_text._M_len;
      s._M_len = comment_index;
      absl::lts_20250127::strings_internal::ConvertibleToStringView::ConvertibleToStringView
                (&local_258,s);
      text_02.value_._M_str._0_4_ = (int)(this->options_).variable_delimiter;
      text_02.value_._M_len = (size_t)local_258.value_._M_str;
      text_02.value_._M_str._4_4_ = 0;
      absl::lts_20250127::StrSplit<char>
                (&local_248,(lts_20250127 *)local_258.value_._M_len,text_02,d);
      local_230 = &local_248;
      absl::lts_20250127::strings_internal::
      Splitter<absl::lts_20250127::ByChar,_absl::lts_20250127::AllowEmpty,_std::basic_string_view<char,_std::char_traits<char>_>_>
      ::begin((const_iterator *)&__end3.delimiter_,local_230);
      absl::lts_20250127::strings_internal::
      Splitter<absl::lts_20250127::ByChar,_absl::lts_20250127::AllowEmpty,_std::basic_string_view<char,_std::char_traits<char>_>_>
      ::end((const_iterator *)&chunk._M_str,local_230);
      while (bVar5 = absl::lts_20250127::strings_internal::operator!=
                               ((SplitIterator<absl::lts_20250127::strings_internal::Splitter<absl::lts_20250127::ByChar,_absl::lts_20250127::AllowEmpty,_std::basic_string_view<char,_std::char_traits<char>_>_>_>
                                 *)&__end3.delimiter_,
                                (SplitIterator<absl::lts_20250127::strings_internal::Splitter<absl::lts_20250127::ByChar,_absl::lts_20250127::AllowEmpty,_std::basic_string_view<char,_std::char_traits<char>_>_>_>
                                 *)&chunk._M_str), pSVar3 = __range3, bVar5) {
        pvVar6 = absl::lts_20250127::strings_internal::
                 SplitIterator<absl::lts_20250127::strings_internal::Splitter<absl::lts_20250127::ByChar,_absl::lts_20250127::AllowEmpty,_std::basic_string_view<char,_std::char_traits<char>_>_>_>
                 ::operator*((SplitIterator<absl::lts_20250127::strings_internal::Splitter<absl::lts_20250127::ByChar,_absl::lts_20250127::AllowEmpty,_std::basic_string_view<char,_std::char_traits<char>_>_>_>
                              *)&__end3.delimiter_);
        prev = (value_type *)pvVar6->_M_len;
        chunk._M_len = (size_t)pvVar6->_M_str;
        bVar5 = std::
                vector<google::protobuf::io::Printer::Format::Chunk,_std::allocator<google::protobuf::io::Printer::Format::Chunk>_>
                ::empty(&pvStack_218->chunks);
        if ((bVar5) || ((total_len._7_1_ & 1) != 0)) {
LAB_003c3dc2:
          if (((total_len._7_1_ & 1) != 0) ||
             (bVar5 = std::basic_string_view<char,_std::char_traits<char>_>::empty
                                ((basic_string_view<char,_std::char_traits<char>_> *)&prev), !bVar5)
             ) {
            local_348.text._M_len = (size_t)prev;
            local_348.text._M_str = (char *)chunk._M_len;
            local_348.is_var = (bool)(total_len._7_1_ & 1);
            std::
            vector<google::protobuf::io::Printer::Format::Chunk,_std::allocator<google::protobuf::io::Printer::Format::Chunk>_>
            ::push_back(&pvStack_218->chunks,&local_348);
          }
          sVar8 = std::basic_string_view<char,_std::char_traits<char>_>::size
                            ((basic_string_view<char,_std::char_traits<char>_> *)&prev);
          __range3 = (Splitter<absl::lts_20250127::ByChar,_absl::lts_20250127::AllowEmpty,_std::basic_string_view<char,_std::char_traits<char>_>_>
                      *)((long)&(__range3->text_)._M_len + sVar8);
          if ((total_len._7_1_ & 1) != 0) {
            __range3 = (Splitter<absl::lts_20250127::ByChar,_absl::lts_20250127::AllowEmpty,_std::basic_string_view<char,_std::char_traits<char>_>_>
                        *)((long)&(__range3->text_)._M_len + 2);
          }
          total_len._7_1_ = (total_len._7_1_ ^ 0xff) & 1;
        }
        else {
          local_2e0 = std::
                      vector<google::protobuf::io::Printer::Format::Chunk,_std::allocator<google::protobuf::io::Printer::Format::Chunk>_>
                      ::back(&pvStack_218->chunks);
          local_2f0 = (local_2e0->text)._M_len;
          local_2e8 = (local_2e0->text)._M_str;
          std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                    (&local_300,"_start");
          __x_00._M_str = local_2e8;
          __x_00._M_len = local_2f0;
          bVar5 = std::operator==(__x_00,local_300);
          if (!bVar5) {
            local_310 = (local_2e0->text)._M_len;
            local_308 = (local_2e0->text)._M_str;
            std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                      (&local_320,"_end");
            __x._M_str = local_308;
            __x._M_len = local_310;
            bVar5 = std::operator==(__x,local_320);
            if (!bVar5) goto LAB_003c3dc2;
          }
          __str_00 = std::basic_string_view<char,_std::char_traits<char>_>::data(&local_2e0->text);
          sVar8 = std::basic_string_view<char,_std::char_traits<char>_>::size(&local_2e0->text);
          sVar7 = std::basic_string_view<char,_std::char_traits<char>_>::size
                            ((basic_string_view<char,_std::char_traits<char>_> *)&prev);
          std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                    (&local_330,__str_00,sVar8 + 1 + sVar7);
          (local_2e0->text)._M_len = local_330._M_len;
          (local_2e0->text)._M_str = local_330._M_str;
          sVar8 = std::basic_string_view<char,_std::char_traits<char>_>::size
                            ((basic_string_view<char,_std::char_traits<char>_> *)&prev);
          __range3 = (Splitter<absl::lts_20250127::ByChar,_absl::lts_20250127::AllowEmpty,_std::basic_string_view<char,_std::char_traits<char>_>_>
                      *)((long)&(__range3->text_)._M_len + sVar8 + 1);
        }
        absl::lts_20250127::strings_internal::
        SplitIterator<absl::lts_20250127::strings_internal::Splitter<absl::lts_20250127::ByChar,_absl::lts_20250127::AllowEmpty,_std::basic_string_view<char,_std::char_traits<char>_>_>_>
        ::operator++((SplitIterator<absl::lts_20250127::strings_internal::Splitter<absl::lts_20250127::ByChar,_absl::lts_20250127::AllowEmpty,_std::basic_string_view<char,_std::char_traits<char>_>_>_>
                      *)&__end3.delimiter_);
      }
      pSVar9 = (Splitter<absl::lts_20250127::ByChar,_absl::lts_20250127::AllowEmpty,_std::basic_string_view<char,_std::char_traits<char>_>_>
                *)std::basic_string_view<char,_std::char_traits<char>_>::size
                            ((basic_string_view<char,_std::char_traits<char>_> *)&comment_index);
      local_350 = options->use_annotation_frames;
      local_358._0_2_ = options->loc;
      local_358._2_1_ = options->checks_are_debug_only;
      local_358._3_1_ = options->use_substitution_map;
      local_358._4_1_ = options->use_curly_brace_substitutions;
      local_358._5_1_ = options->allow_digit_substitutions;
      local_358._6_1_ = options->strip_spaces_around_vars;
      local_358._7_1_ = options->strip_raw_string_indentation;
      local_370.line = pvStack_218;
      absl::lts_20250127::FunctionRef<std::__cxx11::string()>::
      FunctionRef<google::protobuf::io::Printer::TokenizeFormat(std::basic_string_view<char,std::char_traits<char>>,google::protobuf::io::Printer::PrintOptions_const&)::__0,void>
                ((FunctionRef<std::__cxx11::string()> *)&local_368,&local_370);
      message.invoker_ = (Invoker<std::__cxx11::basic_string<char>_>)local_360;
      message.ptr_.obj = local_368.obj;
      opts.use_annotation_frames = local_350;
      opts.loc.super__Optional_base<google::protobuf::io::Printer::SourceLocation,_true,_true>.
      _M_payload.super__Optional_payload_base<google::protobuf::io::Printer::SourceLocation> =
           (_Optional_base<google::protobuf::io::Printer::SourceLocation,_true,_true>)
           (_Optional_base<google::protobuf::io::Printer::SourceLocation,_true,_true>)
           (undefined2)local_358;
      opts.checks_are_debug_only = (bool)local_358._2_1_;
      opts.use_substitution_map = (bool)local_358._3_1_;
      opts.use_curly_brace_substitutions = (bool)local_358._4_1_;
      opts.allow_digit_substitutions = (bool)local_358._5_1_;
      opts.strip_spaces_around_vars = (bool)local_358._6_1_;
      opts.strip_raw_string_indentation = (bool)local_358._7_1_;
      pPVar11 = local_360;
      Validate(pSVar3 == pSVar9,opts,message);
      while (((bVar5 = std::
                       vector<google::protobuf::io::Printer::Format::Chunk,_std::allocator<google::protobuf::io::Printer::Format::Chunk>_>
                       ::empty(&pvStack_218->chunks), ((bVar5 ^ 0xffU) & 1) != 0 &&
              (this_00 = std::
                         vector<google::protobuf::io::Printer::Format::Chunk,_std::allocator<google::protobuf::io::Printer::Format::Chunk>_>
                         ::back(&pvStack_218->chunks), (this_00->is_var & 1U) == 0)) &&
             (bVar5 = std::basic_string_view<char,_std::char_traits<char>_>::empty(&this_00->text),
             bVar5))) {
        std::
        vector<google::protobuf::io::Printer::Format::Chunk,_std::allocator<google::protobuf::io::Printer::Format::Chunk>_>
        ::pop_back(&pvStack_218->chunks);
      }
    }
    else {
      psVar1 = &(this->options_).ignored_comment_start;
      local_1c0 = psVar1->_M_len;
      local_1b8 = (this->options_).ignored_comment_start._M_str;
      __str._M_len = psVar1->_M_len;
      __str._M_str = psVar1->_M_str;
      pcVar10 = (char *)0x0;
      local_1b0 = std::basic_string_view<char,_std::char_traits<char>_>::find
                            ((basic_string_view<char,_std::char_traits<char>_> *)&comment_index,
                             __str,0);
      if (local_1b0 == 0xffffffffffffffff) goto LAB_003c3a70;
      bVar12 = std::basic_string_view<char,_std::char_traits<char>_>::substr
                         ((basic_string_view<char,_std::char_traits<char>_> *)&comment_index,0,
                          local_1b0);
      str._M_str = bVar12._M_str;
      line_indent = bVar12._M_len;
      str._M_len = (size_t)str._M_str;
      pcStack_1f0 = str._M_str;
      local_1d0 = (lts_20250127 *)line_indent;
      pcStack_1c8 = str._M_str;
      comment_index = line_indent;
      line_text._M_len = (size_t)str._M_str;
      sVar13 = absl::lts_20250127::StripLeadingAsciiWhitespace((lts_20250127 *)line_indent,str);
      local_1e0._M_str = sVar13._M_str;
      pcVar10 = (char *)sVar13._M_len;
      local_1e0._M_len = (size_t)pcVar10;
      bVar5 = std::basic_string_view<char,_std::char_traits<char>_>::empty(&local_1e0);
      if (!bVar5) goto LAB_003c3a70;
      __range2._7_1_ = 0;
    }
    absl::lts_20250127::strings_internal::
    SplitIterator<absl::lts_20250127::strings_internal::Splitter<absl::lts_20250127::ByChar,_absl::lts_20250127::AllowEmpty,_std::basic_string_view<char,_std::char_traits<char>_>_>_>
    ::operator++((SplitIterator<absl::lts_20250127::strings_internal::Splitter<absl::lts_20250127::ByChar,_absl::lts_20250127::AllowEmpty,_std::basic_string_view<char,_std::char_traits<char>_>_>_>
                  *)&__end2.delimiter_);
  } while( true );
}

Assistant:

Printer::Format Printer::TokenizeFormat(absl::string_view format_string,
                                        const PrintOptions& options) {
  Format format;
  size_t raw_string_indent = 0;
  if (options.strip_raw_string_indentation) {
    // We are processing a call that looks like
    //
    // p->Emit(R"cc(
    //   class Foo {
    //     int x, y, z;
    //   };
    // )cc");
    //
    // or
    //
    // p->Emit(R"cc(
    //
    //   class Foo {
    //     int x, y, z;
    //   };
    // )cc");
    //
    // To compute the indent, we need:
    //   1. Iterate over each line.
    //   2. Find the first line that contains non-whitespace characters.
    //   3. Count the number of leading spaces on that line.
    //
    // The following pairs of loops assume the current line is the first line
    // with non-whitespace characters; if we consume all the spaces and
    // then immediately hit a newline, this means this wasn't the right line and
    // we should start over.
    //
    // Note that the very first character *must* be a newline; that is how we
    // detect that this is a multi-line raw string template, and as such this is
    // a while loop, not a do/while loop.

    absl::string_view orig = format_string;
    absl::string_view first_pp_directive;
    while (absl::ConsumePrefix(&format_string, "\n")) {
      // clang-format will think a # at the beginning of the line in a raw
      // string is a preprocessor directive and put it at the start of the line,
      // which throws off indent calculation. Skip past those to find code that
      // is indented more realistically.
      if (absl::StartsWith(format_string, "#")) {
        // We don't want to drop the first #... lines. We just want to skip
        // through here. Remember to allow resetting later.
        if (first_pp_directive.empty()) {
          first_pp_directive = format_string;
        }
        size_t next_newline_index = format_string.find('\n');
        if (next_newline_index != absl::string_view::npos) {
          format_string = format_string.substr(next_newline_index);
          continue;
        }
      }
      raw_string_indent = 0;
      format.is_raw_string = true;
      while (absl::ConsumePrefix(&format_string, " ")) {
        ++raw_string_indent;
      }
    }
    // Reset if we skipped through some #... lines, so that we don't drop them.
    if (!first_pp_directive.empty()) {
      format_string = first_pp_directive;
    }

    // If we consume the entire string, this probably wasn't a raw string and
    // was probably something like a couple of explicit newlines.
    if (format_string.empty()) {
      format_string = orig;
      format.is_raw_string = false;
      raw_string_indent = 0;
    }

    // This means we have a preprocessor directive and we should not have eaten
    // the newline.
    if (!at_start_of_line_ && absl::StartsWith(format_string, "#")) {
      format_string = orig;
    }
  }

  // We now split the remaining format string into lines and discard:
  //   1. A trailing Printer-discarded comment, if this is a raw string.
  //
  //   2. All leading spaces to compute that line's indent.
  //      We do not do this for the first line, so that Emit("  ") works
  //      correctly. We do this *regardless* of whether we are processing
  //      a raw string, because existing non-raw-string calls to cpp::Formatter
  //      rely on this. There is a test that validates this behavior.
  //
  //   3. Set the indent for that line to max(0, line_indent -
  //      raw_string_indent), if this is not a raw string.
  //
  //   4. Trailing empty lines, if we know this is a raw string, except for
  //      a single extra newline at the end.
  //
  // Each line is itself split into chunks along the variable delimiters, e.g.
  // $...$.
  bool is_first = true;
  for (absl::string_view line_text : absl::StrSplit(format_string, '\n')) {
    if (format.is_raw_string) {
      size_t comment_index = line_text.find(options_.ignored_comment_start);
      if (comment_index != absl::string_view::npos) {
        line_text = line_text.substr(0, comment_index);
        if (absl::StripLeadingAsciiWhitespace(line_text).empty()) {
          // If the first line is part of an ignored comment, consider that a
          // first line as well.
          is_first = false;
          continue;
        }
      }
    }

    size_t line_indent = 0;
    while (!is_first && absl::ConsumePrefix(&line_text, " ")) {
      ++line_indent;
    }
    is_first = false;

    format.lines.emplace_back();
    auto& line = format.lines.back();
    line.indent =
        line_indent > raw_string_indent ? line_indent - raw_string_indent : 0;

    bool is_var = false;
    size_t total_len = 0;
    for (absl::string_view chunk :
         absl::StrSplit(line_text, options_.variable_delimiter)) {
      // The special _start and _end variables should actually glom the next
      // chunk into themselves, so as to be of the form _start$foo and _end$foo.
      if (!line.chunks.empty() && !is_var) {
        auto& prev = line.chunks.back();
        if (prev.text == "_start" || prev.text == "_end") {
          // The +1 below is to account for the $ in between them.
          // This string is safe, because prev.text and chunk are contiguous
          // by construction.
          prev.text = absl::string_view(prev.text.data(),
                                        prev.text.size() + 1 + chunk.size());

          // Account for the foo$ part of $_start$foo$.
          total_len += chunk.size() + 1;
          continue;
        }
      }

      if (is_var || !chunk.empty()) {
        line.chunks.push_back(Format::Chunk{chunk, is_var});
      }

      total_len += chunk.size();
      if (is_var) {
        // This accounts for the $s around a variable.
        total_len += 2;
      }

      is_var = !is_var;
    }

    // To ensure there are no unclosed $...$, we check that the computed length
    // above equals the actual length of the string. If it's off, that means
    // that there are missing or extra $ characters.
    Validate(total_len == line_text.size(), options, [&line] {
      if (line.chunks.empty()) {
        return std::string("wrong number of variable delimiters");
      }

      return absl::StrFormat("unclosed variable name: `%s`",
                             absl::CHexEscape(line.chunks.back().text));
    });

    // Trim any empty, non-variable chunks.
    while (!line.chunks.empty()) {
      auto& last = line.chunks.back();
      if (last.is_var || !last.text.empty()) {
        break;
      }

      line.chunks.pop_back();
    }
  }

  // Discard any trailing newlines (i.e., lines which contain no chunks.)
  if (format.is_raw_string) {
    while (!format.lines.empty() && format.lines.back().chunks.empty()) {
      format.lines.pop_back();
    }
  }

#if 0  // Use this to aid debugging tokenization.
  LOG(INFO) << "--- " << format.lines.size() << " lines";
  for (size_t i = 0; i < format.lines.size(); ++i) {
    const auto& line = format.lines[i];

    auto log_line = absl::StrFormat("[\" \" x %d]", line.indent);
    for (const auto& chunk : line.chunks) {
      absl::StrAppendFormat(&log_line, " %s\"%s\"", chunk.is_var ? "$" : "",
                            absl::CHexEscape(chunk.text));
    }
    LOG(INFO) << log_line;
  }
  LOG(INFO) << "---";
#endif

  return format;
}